

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O2

Matrix4f * Matrix4f::translation(float x,float y,float z)

{
  undefined8 uVar1;
  Matrix4f *in_RDI;
  
  in_RDI->m_elements[0] = 1.0;
  in_RDI->m_elements[1] = 0.0;
  in_RDI->m_elements[2] = 0.0;
  in_RDI->m_elements[3] = 0.0;
  in_RDI->m_elements[4] = 0.0;
  in_RDI->m_elements[5] = 1.0;
  in_RDI->m_elements[6] = 0.0;
  in_RDI->m_elements[7] = 0.0;
  in_RDI->m_elements[8] = 0.0;
  in_RDI->m_elements[9] = 0.0;
  uVar1 = vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
  *(undefined8 *)(in_RDI->m_elements + 10) = uVar1;
  in_RDI->m_elements[0xc] = x;
  in_RDI->m_elements[0xd] = y;
  in_RDI->m_elements[0xe] = z;
  in_RDI->m_elements[0xf] = 1.0;
  return in_RDI;
}

Assistant:

Matrix4f::Matrix4f( float m00, float m01, float m02, float m03,
				   float m10, float m11, float m12, float m13,
				   float m20, float m21, float m22, float m23,
				   float m30, float m31, float m32, float m33 )
{
	m_elements[ 0 ] = m00;
	m_elements[ 1 ] = m10;
	m_elements[ 2 ] = m20;
	m_elements[ 3 ] = m30;
	
	m_elements[ 4 ] = m01;
	m_elements[ 5 ] = m11;
	m_elements[ 6 ] = m21;
	m_elements[ 7 ] = m31;

	m_elements[ 8 ] = m02;
	m_elements[ 9 ] = m12;
	m_elements[ 10 ] = m22;
	m_elements[ 11 ] = m32;

	m_elements[ 12 ] = m03;
	m_elements[ 13 ] = m13;
	m_elements[ 14 ] = m23;
	m_elements[ 15 ] = m33;
}